

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_win_part(ggml_context *ctx,ggml_tensor *a,int w)

{
  ggml_tensor *tensor;
  ggml_tensor *pgVar1;
  int in_EDX;
  ggml_tensor *in_RSI;
  int32_t params [3];
  ggml_tensor *result;
  int64_t ne [4];
  int np;
  int npy;
  int npx;
  int py;
  int px;
  int in_stack_ffffffffffffff88;
  ggml_type in_stack_ffffffffffffff8c;
  
  if (in_RSI->ne[3] != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1205,"GGML_ASSERT(%s) failed","a->ne[3] == 1");
  }
  if (in_RSI->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1206,"GGML_ASSERT(%s) failed","a->type == GGML_TYPE_F32");
  }
  tensor = (ggml_tensor *)(long)in_EDX;
  pgVar1 = ggml_new_tensor((ggml_context *)tensor,in_stack_ffffffffffffff8c,
                           in_stack_ffffffffffffff88,(int64_t *)0x15273b);
  ggml_set_op_params(tensor,(void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     0x15276c);
  pgVar1->op = GGML_OP_WIN_PART;
  pgVar1->src[0] = in_RSI;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_win_part(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   w) {
    GGML_ASSERT(a->ne[3] == 1);
    GGML_ASSERT(a->type  == GGML_TYPE_F32);

    // padding
    const int px = (w - a->ne[1]%w)%w;
    const int py = (w - a->ne[2]%w)%w;

    const int npx = (px + a->ne[1])/w;
    const int npy = (py + a->ne[2])/w;
    const int np  = npx*npy;

    const int64_t ne[4] = { a->ne[0], w, w, np, };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    int32_t params[] = { npx, npy, w };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_WIN_PART;
    result->src[0] = a;

    return result;
}